

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O3

int find_children_proc(Am_Object *self)

{
  char cVar1;
  int iVar2;
  int iVar3;
  Am_Value *pAVar4;
  ushort uVar5;
  int iVar6;
  Am_Object item;
  Am_Value_List nodes;
  Am_Object local_40 [8];
  Am_Value_List local_38 [16];
  
  pAVar4 = (Am_Value *)Am_Object::Get((ushort)self,0x85);
  iVar2 = Am_Value::operator_cast_to_int(pAVar4);
  Am_Object::Get_Object((ushort)local_40,(ulong)self);
  pAVar4 = (Am_Value *)Am_Object::Get((ushort)local_40,0x82);
  Am_Value_List::Am_Value_List(local_38,pAVar4);
  Am_Object::~Am_Object(local_40);
  Am_Value_List::Start();
  iVar6 = 0;
  while( true ) {
    cVar1 = Am_Value_List::Last();
    if (cVar1 != '\0') break;
    pAVar4 = (Am_Value *)Am_Value_List::Get();
    Am_Object::Am_Object(local_40,pAVar4);
    uVar5 = (ushort)local_40;
    pAVar4 = (Am_Value *)Am_Object::Get(uVar5,(ulong)PARENT);
    iVar3 = Am_Value::operator_cast_to_int(pAVar4);
    if (iVar3 == iVar2) {
      cVar1 = Am_Object::operator!=(local_40,self);
      if (cVar1 != '\0') {
        pAVar4 = (Am_Value *)Am_Object::Get(uVar5,(ulong)CHILDREN);
        iVar3 = Am_Value::operator_cast_to_int(pAVar4);
        iVar6 = iVar6 + iVar3;
      }
    }
    Am_Object::~Am_Object(local_40);
    Am_Value_List::Next();
  }
  Am_Value_List::~Am_Value_List(local_38);
  return iVar6 + (uint)(iVar6 == 0);
}

Assistant:

Am_Define_Formula(int, find_children)
{
  int rank = self.Get(Am_RANK);
  int children = 0;
  Am_Value_List nodes = self.Get_Owner().Get(Am_GRAPHICAL_PARTS);
  for (nodes.Start(); !nodes.Last(); nodes.Next()) {
    Am_Object item = nodes.Get();
    if ((int)item.Get(PARENT) == rank && item != self)
      children += (int)item.Get(CHILDREN);
  }
  if (children)
    return children;
  else
    return 1;
}